

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

tchar_t * tcscpy_s(tchar_t *Out,size_t OutLen,tchar_t *In)

{
  size_t sVar1;
  size_t local_30;
  size_t n;
  tchar_t *In_local;
  size_t OutLen_local;
  tchar_t *Out_local;
  
  if (In != (tchar_t *)0x0) {
    if (OutLen != 0) {
      sVar1 = strlen(In);
      if (OutLen - 1 < sVar1) {
        local_30 = OutLen - 1;
      }
      else {
        local_30 = strlen(In);
      }
      memcpy(Out,In,local_30);
      Out[local_30] = '\0';
    }
    return Out;
  }
  __assert_fail("In != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                ,0x60,"tchar_t *tcscpy_s(tchar_t *, size_t, const tchar_t *)");
}

Assistant:

tchar_t* tcscpy_s(tchar_t* Out,size_t OutLen,const tchar_t* In)
{
    assert(In != NULL);
	if (OutLen>0)
	{
		size_t n = MIN(tcslen(In),OutLen-1);
		memcpy(Out,In,n*sizeof(tchar_t));
		Out[n] = 0;
	}
    return Out;
}